

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen1_2x3.cpp
# Opt level: O0

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcCompositeCurveSegment>
                 (DB *db,LIST *params,IfcCompositeCurveSegment *in)

{
  size_t sVar1;
  TypeError *this;
  TypeError *t_2;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_2;
  TypeError *t_1;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_1;
  TypeError *t;
  undefined1 local_70 [8];
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg;
  allocator<char> local_49;
  string local_48;
  size_t local_28;
  size_t base;
  IfcCompositeCurveSegment *in_local;
  LIST *params_local;
  DB *db_local;
  
  base = (size_t)in;
  in_local = (IfcCompositeCurveSegment *)params;
  params_local = (LIST *)db;
  local_28 = GenericFill<Assimp::IFC::Schema_2x3::IfcGeometricRepresentationItem>
                       (db,params,&in->super_IfcGeometricRepresentationItem);
  sVar1 = EXPRESS::LIST::GetSize((LIST *)in_local);
  if (2 < sVar1) {
    local_28 = local_28 + 1;
    EXPRESS::LIST::operator[]((LIST *)local_70,(size_t)in_local);
    GenericConvert<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(base + 0x30),
               (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70,(DB *)params_local);
    std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
              ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70);
    local_28 = local_28 + 1;
    EXPRESS::LIST::operator[]((LIST *)&t_1,(size_t)in_local);
    GenericConvert<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(base + 0x50),
               (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_1,(DB *)params_local);
    std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
              ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_1);
    local_28 = local_28 + 1;
    EXPRESS::LIST::operator[]((LIST *)&t_2,(size_t)in_local);
    GenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>>
              ((Lazy<Assimp::IFC::Schema_2x3::IfcCurve> *)(base + 0x70),
               (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_2,(DB *)params_local);
    std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
              ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_2);
    return local_28;
  }
  arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._3_1_ = 1;
  this = (TypeError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"expected 3 arguments to IfcCompositeCurveSegment",&local_49);
  TypeError::TypeError(this,&local_48,0xffffffffffffffff,0xffffffffffffffff);
  arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._3_1_ = 0;
  __cxa_throw(this,&TypeError::typeinfo,TypeError::~TypeError);
}

Assistant:

size_t GenericFill<IfcCompositeCurveSegment>(const DB& db, const LIST& params, IfcCompositeCurveSegment* in)
{
	size_t base = GenericFill(db,params,static_cast<IfcGeometricRepresentationItem*>(in));
	if (params.GetSize() < 3) { throw STEP::TypeError("expected 3 arguments to IfcCompositeCurveSegment"); }    do { // convert the 'Transition' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->Transition, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 0 to IfcCompositeCurveSegment to be a `IfcTransitionCode`")); }
    } while(0);
    do { // convert the 'SameSense' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->SameSense, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 1 to IfcCompositeCurveSegment to be a `BOOLEAN`")); }
    } while(0);
    do { // convert the 'ParentCurve' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->ParentCurve, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 2 to IfcCompositeCurveSegment to be a `IfcCurve`")); }
    } while(0);
	return base;
}